

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfBoxAttribute.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::writeValueTo
          (TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *this,OStream *os,int version)

{
  int local_1c;
  
  local_1c = (this->_value).min.x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).min.y;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).max.x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = (this->_value).max.y;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  return;
}

Assistant:

IMF_EXPORT void
Box2iAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.min.x);
    Xdr::write<StreamIO> (os, _value.min.y);
    Xdr::write<StreamIO> (os, _value.max.x);
    Xdr::write<StreamIO> (os, _value.max.y);
}